

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_spectral_pairs_digital_filter.cc
# Opt level: O0

bool __thiscall
sptk::LineSpectralPairsDigitalFilter::Run
          (LineSpectralPairsDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  const_iterator cVar5;
  iterator iVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  long in_RCX;
  double *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double *in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  double delayed_output;
  int i_1;
  int i;
  double x2;
  double x1;
  double sum;
  double *d2;
  double *d1;
  double *ab;
  double gained_input;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar10;
  size_type in_stack_ffffffffffffff38;
  value_type vVar11;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  value_type vVar12;
  double local_b8;
  
  if (((((*(byte *)((long)in_RDI + 0xc) & 1) == 0) ||
       (sVar2 = ::std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar2 != (long)(*(int *)(in_RDI + 1) + 1))) || (in_RDX == (double *)0x0)) || (in_RCX == 0)) {
    return false;
  }
  sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
  if (sVar2 != (long)(*(int *)(in_RDI + 1) + 1)) {
    ::std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
    ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
    __first._M_current._4_4_ = in_stack_ffffffffffffff34;
    __first._M_current._0_4_ = in_stack_ffffffffffffff30;
    ::std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first,in_stack_ffffffffffffff28,in_RDI);
  }
  sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20));
  if (sVar2 != (long)(*(int *)(in_RDI + 1) + 1)) {
    ::std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
    ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
    __first_00._M_current._4_4_ = in_stack_ffffffffffffff34;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffff30;
    ::std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first_00,in_stack_ffffffffffffff28,in_RDI);
  }
  sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x38));
  if (sVar2 != (long)*(int *)(in_RDI + 1)) {
    ::std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  local_b8 = (double)in_XMM0_Qa * *pvVar3;
  if (*(int *)(in_RDI + 1) == 0) {
    *in_RDX = local_b8;
    return true;
  }
  ::std::vector<double,_std::allocator<double>_>::begin(in_XMM0_Qa);
  _Var4 = __gnu_cxx::
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+(in_stack_ffffffffffffff28._M_current,in_RDI);
  cVar5 = ::std::vector<double,_std::allocator<double>_>::end(in_XMM0_Qa);
  iVar6 = ::std::vector<double,_std::allocator<double>_>::begin(in_XMM0_Qa);
  ::std::
  transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::LineSpectralPairsDigitalFilter::Run(std::vector<double,std::allocator<double>>const&,double,double*,sptk::LineSpectralPairsDigitalFilter::Buffer*)const::__0>
            (_Var4._M_current,cVar5._M_current,iVar6._M_current);
  pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x38),0);
  pvVar8 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),0);
  pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
  vVar12 = *pvVar8;
  vVar11 = *pvVar9;
  for (iVar10 = 1; iVar10 < *(int *)(in_RDI + 1); iVar10 = iVar10 + 2) {
    pvVar8[iVar10] = vVar12 * pvVar7[iVar10 + -1] + pvVar8[iVar10];
    pvVar9[iVar10] = vVar11 * pvVar7[iVar10] + pvVar9[iVar10];
    pvVar8[iVar10 + 1] = vVar12 + pvVar8[iVar10 + 1];
    pvVar9[iVar10 + 1] = vVar11 + pvVar9[iVar10 + 1];
    vVar12 = pvVar8[iVar10 + 1];
    vVar11 = pvVar9[iVar10 + 1];
    local_b8 = pvVar8[iVar10] + pvVar9[iVar10] + local_b8;
  }
  bVar1 = IsEven(*(int *)(in_RDI + 1));
  if (!bVar1) {
    pvVar8[*(int *)(in_RDI + 1)] =
         vVar12 * pvVar7[*(int *)(in_RDI + 1) + -1] + pvVar8[*(int *)(in_RDI + 1)];
  }
  local_b8 = (pvVar8[*(int *)(in_RDI + 1)] - pvVar9[*(int *)(in_RDI + 1)]) + local_b8;
  *in_RDX = local_b8;
  for (iVar10 = *(int *)(in_RDI + 1); 0 < iVar10; iVar10 = iVar10 + -1) {
    pvVar8[iVar10] = pvVar8[iVar10 + -1];
    pvVar9[iVar10] = pvVar9[iVar10 + -1];
  }
  local_b8 = local_b8 * -0.5;
  *pvVar8 = local_b8;
  *pvVar9 = local_b8;
  return true;
}

Assistant:

bool LineSpectralPairsDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output,
    LineSpectralPairsDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d1_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d1_.resize(num_filter_order_ + 1);
    std::fill(buffer->d1_.begin(), buffer->d1_.end(), 0.0);
  }
  if (buffer->d2_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d2_.resize(num_filter_order_ + 1);
    std::fill(buffer->d2_.begin(), buffer->d2_.end(), 0.0);
  }
  if (buffer->ab_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->ab_.resize(num_filter_order_);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  std::transform(filter_coefficients.begin() + 1, filter_coefficients.end(),
                 buffer->ab_.begin(),
                 [](double w) { return -2.0 * std::cos(w); });

  const double* ab(&(buffer->ab_[0]));
  double* d1(&buffer->d1_[0]);
  double* d2(&buffer->d2_[0]);

  // Apply LSP synthesis filter.
  double sum(gained_input);
  {
    double x1(d1[0]);
    double x2(d2[0]);
    for (int i(1); i < num_filter_order_; i += 2) {
      d1[i] += x1 * ab[i - 1];
      d2[i] += x2 * ab[i];
      d1[i + 1] += x1;
      d2[i + 1] += x2;
      x1 = d1[i + 1];
      x2 = d2[i + 1];
      sum += d1[i] + d2[i];
    }
    if (!sptk::IsEven(num_filter_order_)) {
      d1[num_filter_order_] += x1 * ab[num_filter_order_ - 1];
    }
    sum += d1[num_filter_order_] - d2[num_filter_order_];
  }

  // Save result.
  *filter_output = sum;

  // Shift stored signals.
  for (int i(num_filter_order_); 0 < i; --i) {
    d1[i] = d1[i - 1];
    d2[i] = d2[i - 1];
  }
  const double delayed_output(-0.5 * sum);
  d1[0] = delayed_output;
  d2[0] = delayed_output;

  return true;
}